

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O1

void __thiscall
ki::protocol::dml::Message::set_template(Message *this,MessageTemplate *message_template)

{
  pointer pcVar1;
  Record *this_00;
  Record *record;
  ostringstream oss;
  istringstream iss;
  undefined1 *local_318 [2];
  undefined1 local_308 [360];
  istringstream local_1a0 [120];
  ios_base local_128 [264];
  
  this->m_template = message_template;
  if (message_template != (MessageTemplate *)0x0) {
    this_00 = (Record *)operator_new(0x50);
    record = MessageTemplate::get_record(message_template);
    ki::dml::Record::Record(this_00,record);
    this->m_record = this_00;
    if ((this->m_raw_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->m_raw_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_318[0] = local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_318);
      std::__cxx11::istringstream::istringstream(local_1a0,(string *)local_318,_S_in);
      if (local_318[0] != local_308) {
        operator_delete(local_318[0]);
      }
      ki::dml::Record::read_from(this->m_record,(istream *)local_1a0);
      pcVar1 = (this->m_raw_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->m_raw_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar1) {
        (this->m_raw_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar1;
      }
      std::__cxx11::istringstream::~istringstream(local_1a0);
      std::ios_base::~ios_base(local_128);
    }
  }
  return;
}

Assistant:

void Message::set_template(const MessageTemplate *message_template)
	{
		m_template = message_template;
		if (!m_template)
			return;

		m_record = new ki::dml::Record(message_template->get_record());
		if (!m_raw_data.empty())
		{
			std::istringstream iss(std::string(m_raw_data.data(), m_raw_data.size()));
			try
			{
				m_record->read_from(iss);
				m_raw_data.clear();
			}
			catch (ki::dml::parse_error &e)
			{
				delete m_record;
				m_template = nullptr;
				m_record = nullptr;

				std::ostringstream oss;
				oss << "Error reading DML message payload: " << e.what();
				throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
			}
		}
	}